

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::ThreadOpenAddedConnections(CConnman *this)

{
  CSemaphore *this_00;
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CConnman *in_RSI;
  pointer pAVar5;
  duration rel_time;
  long in_FS_OFFSET;
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> vInfo;
  CSemaphoreGrant grant;
  CAddress addr;
  vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> local_c0;
  CSemaphoreGrant local_a8;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    local_a8.sem = (this->semAddnode)._M_t.
                   super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                   super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                   super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
    local_a8.fHaveGrant = false;
    CSemaphore::wait(local_a8.sem,in_RSI);
    local_a8.fHaveGrant = true;
    in_RSI = this;
    GetAddedNodeInfo(&local_c0,this,false);
    pAVar1 = local_c0.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_c0.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c0.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar2 = true;
      rel_time.__r = 2000000000;
    }
    else {
      bVar3 = false;
      pAVar5 = local_c0.super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar4 = 4;
        if (local_a8.fHaveGrant == true) {
          CService::CService((CService *)&local_98.indirect_contents);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents
                     ,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                      &local_98.indirect_contents);
          local_58 = local_80;
          local_50 = local_78;
          local_48 = 100000000;
          local_40 = 0;
          if (0x10 < local_88) {
            free(local_98.indirect_contents.indirect);
            local_98.indirect_contents.indirect = (char *)0x0;
          }
          OpenNetworkConnection
                    (this,(CAddress *)&local_70.indirect_contents,false,&local_a8,
                     (pAVar5->m_params).m_added_node._M_dataplus._M_p,MANUAL,
                     (pAVar5->m_params).m_use_v2transport);
          in_RSI = (CConnman *)0x1dcd6500;
          bVar2 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
          iVar4 = 1;
          if (bVar2) {
            this_00 = (this->semAddnode)._M_t.
                      super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                      super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                      super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
            bVar2 = CSemaphore::try_wait(this_00);
            if (local_a8.fHaveGrant == true) {
              CSemaphore::post(local_a8.sem);
            }
            iVar4 = 0;
            local_a8.sem = this_00;
            local_a8.fHaveGrant = bVar2;
          }
          if (0x10 < local_60) {
            free(local_70.indirect_contents.indirect);
            local_70.indirect_contents.indirect = (char *)0x0;
          }
          bVar3 = true;
        }
        if (iVar4 != 0) goto LAB_001aae98;
        pAVar5 = pAVar5 + 1;
      } while (pAVar5 != pAVar1);
      iVar4 = 4;
LAB_001aae98:
      bVar2 = iVar4 == 4;
      rel_time.__r = 2000000000;
      if (bVar3) {
        rel_time.__r = 60000000000;
      }
    }
    if (bVar2) {
      PerformReconnections(this);
      bVar2 = CThreadInterrupt::sleep_for(&this->interruptNet,rel_time);
      in_RSI = (CConnman *)rel_time.__r;
    }
    else {
      bVar2 = false;
    }
    std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector(&local_c0);
    if (local_a8.fHaveGrant == true) {
      CSemaphore::post(local_a8.sem);
      local_a8.fHaveGrant = false;
    }
    if (bVar2 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void CConnman::ThreadOpenAddedConnections()
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    while (true)
    {
        CSemaphoreGrant grant(*semAddnode);
        std::vector<AddedNodeInfo> vInfo = GetAddedNodeInfo(/*include_connected=*/false);
        bool tried = false;
        for (const AddedNodeInfo& info : vInfo) {
            if (!grant) {
                // If we've used up our semaphore and need a new one, let's not wait here since while we are waiting
                // the addednodeinfo state might change.
                break;
            }
            tried = true;
            CAddress addr(CService(), NODE_NONE);
            OpenNetworkConnection(addr, false, std::move(grant), info.m_params.m_added_node.c_str(), ConnectionType::MANUAL, info.m_params.m_use_v2transport);
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500))) return;
            grant = CSemaphoreGrant(*semAddnode, /*fTry=*/true);
        }
        // See if any reconnections are desired.
        PerformReconnections();
        // Retry every 60 seconds if a connection was attempted, otherwise two seconds
        if (!interruptNet.sleep_for(std::chrono::seconds(tried ? 60 : 2)))
            return;
    }
}